

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

bool __thiscall jbcoin::STObject::operator==(STObject *this,STObject *obj)

{
  pointer pSVar1;
  SField *pSVar2;
  pointer pSVar3;
  int iVar4;
  pointer pSVar5;
  int iVar6;
  int iVar7;
  STVar *t1;
  pointer pSVar8;
  
  pSVar8 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar1 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  iVar6 = 0;
  iVar7 = 0;
  if (pSVar8 != pSVar1) {
    iVar7 = 0;
    do {
      iVar4 = (*pSVar8->p_->_vptr_STBase[4])();
      if ((iVar4 != 0) && (pSVar2 = pSVar8->p_->fName, pSVar2->fieldValue < 0x100)) {
        pSVar5 = (obj->v_).
                 super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pSVar3 = (obj->v_).
                 super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pSVar5 == pSVar3) {
          return false;
        }
        while (pSVar2->fieldCode != pSVar5->p_->fName->fieldCode) {
          pSVar5 = pSVar5 + 1;
          if (pSVar5 == pSVar3) {
            return false;
          }
        }
        iVar4 = (*pSVar5->p_->_vptr_STBase[9])();
        if ((char)iVar4 == '\0') {
          return false;
        }
        iVar7 = iVar7 + 1;
      }
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != pSVar1);
  }
  pSVar8 = (obj->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar1 = (obj->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pSVar8 != pSVar1) {
    iVar6 = 0;
    do {
      iVar4 = (*pSVar8->p_->_vptr_STBase[4])();
      if (iVar4 != 0) {
        iVar6 = iVar6 + (uint)(pSVar8->p_->fName->fieldValue < 0x100);
      }
      pSVar8 = pSVar8 + 1;
    } while (pSVar8 != pSVar1);
  }
  return iVar6 == iVar7;
}

Assistant:

bool STObject::operator== (const STObject& obj) const
{
    // This is not particularly efficient, and only compares data elements
    // with binary representations
    int matches = 0;
    for (auto const& t1 : v_)
    {
        if ((t1->getSType () != STI_NOTPRESENT) && t1->getFName ().isBinary ())
        {
            // each present field must have a matching field
            bool match = false;
            for (auto const& t2 : obj.v_)
            {
                if (t1->getFName () == t2->getFName ())
                {
                    if (t2 != t1)
                        return false;

                    match = true;
                    ++matches;
                    break;
                }
            }

            if (!match)
                return false;
        }
    }

    int fields = 0;
    for (auto const& t2 : obj.v_)
    {
        if ((t2->getSType () != STI_NOTPRESENT) && t2->getFName ().isBinary ())
            ++fields;
    }

    if (fields != matches)
        return false;

    return true;
}